

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O1

char * cf_get_ext(cf_file_t *file)

{
  char *pcVar1;
  char *src;
  int in_R9D;
  
  if (file->name[0] == '\0') {
    src = (char *)0x0;
  }
  else {
    pcVar1 = file->name;
    src = (char *)0x0;
    do {
      pcVar1 = pcVar1 + 1;
      if (*pcVar1 == '.') {
        src = pcVar1;
      }
    } while (*pcVar1 != '\0');
  }
  pcVar1 = file->ext;
  if (src == (char *)0x0) {
    *pcVar1 = '\0';
  }
  else {
    cf_safe_strcpy_internal(pcVar1,src,0,0x20,(char *)0xe7,in_R9D);
  }
  return pcVar1;
}

Assistant:

const char* cf_get_ext(cf_file_t* file)
{
	char* name = file->name;
	char* period = NULL;
	while (*name++) if (*name == '.') period = name;
	if (period) cf_safe_strcpy(file->ext, period, 0, CUTE_FILES_MAX_EXT);
	else file->ext[0] = 0;
	return file->ext;
}